

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall PrintfTest_Pointer_Test::~PrintfTest_Pointer_Test(PrintfTest_Pointer_Test *this)

{
  void *in_RDI;
  
  ~PrintfTest_Pointer_Test((PrintfTest_Pointer_Test *)0x140be8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(PrintfTest, Pointer) {
  int n;
  void *p = &n;
  EXPECT_PRINTF(fmt::format("{}", p), "%p", p);
  p = FMT_NULL;
  EXPECT_PRINTF("(nil)", "%p", p);
  EXPECT_PRINTF("     (nil)", "%10p", p);
  const char *s = "test";
  EXPECT_PRINTF(fmt::format("{:p}", s), "%p", s);
  const char *null_str = FMT_NULL;
  EXPECT_PRINTF("(nil)", "%p", null_str);

  p = &n;
  EXPECT_PRINTF(fmt::format(L"{}", p), L"%p", p);
  p = FMT_NULL;
  EXPECT_PRINTF(L"(nil)", L"%p", p);
  EXPECT_PRINTF(L"     (nil)", L"%10p", p);
  const wchar_t *w = L"test";
  EXPECT_PRINTF(fmt::format(L"{:p}", w), L"%p", w);
  const wchar_t *null_wstr = FMT_NULL;
  EXPECT_PRINTF(L"(nil)", L"%p", null_wstr);
}